

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_peek_next_line(Parser *this,size_t pos)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  yml *pyVar4;
  size_t extraout_RDX;
  char *pcVar5;
  ro_substr chars;
  csubstr cVar6;
  csubstr cVar7;
  basic_substring<const_char> local_38;
  basic_substring<char> local_28;
  
  local_38 = (basic_substring<const_char>)ZEXT816(0);
  if (pos == 0xffffffffffffffff) {
    pos = (this->m_state->pos).super_LineCol.offset;
  }
  pyVar4 = (yml *)0x0;
  pcVar5 = (char *)0x0;
  if (pos < (this->m_buf).len) {
    if ((this->m_buf).len < pos) {
      if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        cVar7 = (csubstr)(*pcVar1)();
        return cVar7;
      }
      handle_error(0x200e84,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_28,(this->m_buf).str + pos,(this->m_buf).len - pos);
    cVar7.len = extraout_RDX;
    cVar7.str = (char *)local_28.len;
    local_38 = from_next_line((yml *)local_28.str,cVar7);
    pyVar4 = (yml *)0x0;
    pcVar5 = (char *)0x0;
    if (local_38.str != (char *)0x0 && local_38.len != 0) {
      chars.len = 2;
      chars.str = "\r\n";
      pcVar3 = (char *)basic_substring<const_char>::first_of(&local_38,chars,0);
      if (pcVar3 == (char *)0xffffffffffffffff) {
        pcVar3 = (char *)0xffffffffffffffff;
      }
      else if (pcVar3 + 1 < local_38.len) {
        if (local_38.len <= pcVar3 + 1) {
          if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            pcVar1 = (code *)swi(3);
            cVar7 = (csubstr)(*pcVar1)();
            return cVar7;
          }
          handle_error(0x200e84,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x14c3,"i >= 0 && i < len");
        }
        pcVar3 = pcVar3 + (((yml *)(local_38.str + 1))[(long)pcVar3] == (yml)0xa &&
                           *(yml *)(local_38.str + (long)pcVar3) == (yml)0xd ||
                          ((yml *)(local_38.str + 1))[(long)pcVar3] == (yml)0xd &&
                          *(yml *)(local_38.str + (long)pcVar3) == (yml)0xa);
      }
      if ((pcVar3 != (char *)0xffffffffffffffff) && (local_38.len < pcVar3)) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar7 = (csubstr)(*pcVar1)();
          return cVar7;
        }
        handle_error(0x200e84,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1572,"pos <= len || pos == npos");
      }
      pyVar4 = (yml *)local_38.str;
      pcVar5 = (char *)local_38.len;
      if (pcVar3 != (char *)0xffffffffffffffff) {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)&local_28,local_38.str,(size_t)(pcVar3 + 1));
        pyVar4 = (yml *)local_28.str;
        pcVar5 = (char *)local_28.len;
      }
    }
  }
  cVar6.len = (size_t)pcVar5;
  cVar6.str = (char *)pyVar4;
  return cVar6;
}

Assistant:

csubstr Parser::_peek_next_line(size_t pos) const
{
    csubstr rem{}; // declare here because of the goto
    size_t nlpos{}; // declare here because of the goto
    pos = pos == npos ? m_state->pos.offset : pos;
    if(pos >= m_buf.len)
        goto next_is_empty;

    // look for the next newline chars, and jump to the right of those
    rem = from_next_line(m_buf.sub(pos));
    if(rem.empty())
        goto next_is_empty;

    // now get everything up to and including the following newline chars
    nlpos = rem.first_of("\r\n");
    if((nlpos != csubstr::npos) && (nlpos + 1 < rem.len))
        nlpos += _extend_from_combined_newline(rem[nlpos], rem[nlpos+1]);
    rem = rem.left_of(nlpos, /*include_pos*/true);

    _c4dbgpf("peek next line @ {}: (len={})'{}'", pos, rem.len, rem.trimr("\r\n"));
    return rem;

next_is_empty:
    _c4dbgpf("peek next line @ {}: (len=0)''", pos);
    return {};
}